

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

Variable * __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareVarying
          (VaryingComponentsTest *this,Type *basic_type,descriptor *desc,GLchar *interpolation,
          ShaderInterface *si,STAGES stage,STORAGE storage)

{
  GLuint n_array_elements;
  GLuint GVar1;
  pointer data;
  Variable *pVVar2;
  VaryingComponentsTest *this_00;
  uint offset;
  Type local_88;
  GLchar *local_78;
  string local_70;
  string local_50;
  
  this_00 = (VaryingComponentsTest *)basic_type;
  local_78 = interpolation;
  n_array_elements =
       (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase.
                          super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 0x110))();
  GVar1 = Utils::Type::GetSize(basic_type);
  prepareName_abi_cxx11_
            (&local_50,this_00,desc->m_name,desc->m_location,desc->m_component,stage,storage);
  offset = desc->m_component * GVar1;
  prepareQualifiers_abi_cxx11_
            (&local_70,this_00,desc->m_location_str,desc->m_component_str,local_78);
  local_88.m_n_rows = desc->m_n_rows;
  local_88._0_8_ = (ulong)basic_type->m_basic_type | 0x100000000;
  data = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + offset;
  if (storage == VARYING_INPUT) {
    pVVar2 = Utils::ShaderInterface::Input<void>
                       (si,local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,desc->m_component,
                        desc->m_location,&local_88,'\0',n_array_elements,0,offset,data,
                        (ulong)(GVar1 * local_88.m_n_rows));
  }
  else {
    pVVar2 = Utils::ShaderInterface::Output<void>
                       (si,local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,desc->m_component,
                        desc->m_location,&local_88,'\0',n_array_elements,0,offset,data,
                        (ulong)(GVar1 * local_88.m_n_rows));
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return pVVar2;
}

Assistant:

Utils::Variable* VaryingComponentsTest::prepareVarying(const Utils::Type& basic_type, const descriptor& desc,
													   const GLchar* interpolation, Utils::ShaderInterface& si,
													   Utils::Shader::STAGES stage, Utils::Variable::STORAGE storage)
{
	const GLuint	   array_length   = getArrayLength();
	const GLuint	   component_size = basic_type.GetSize();
	const std::string& name			  = prepareName(desc.m_name, desc.m_location, desc.m_component, stage, storage);
	const GLuint	   offset		  = desc.m_component * component_size;
	const std::string& qual			  = prepareQualifiers(desc.m_location_str, desc.m_component_str, interpolation);
	const GLuint	   size			  = desc.m_n_rows * component_size;
	const Utils::Type& type			  = Utils::Type::GetType(basic_type.m_basic_type, 1 /* n_columns */, desc.m_n_rows);
	Utils::Variable*   var			  = 0;

	if (Utils::Variable::VARYING_INPUT == storage)
	{
		var = si.Input(name.c_str(), qual.c_str() /* qualifiers */, desc.m_component /* expected_componenet */,
					   desc.m_location /* expected_location */, type, /* built_in_type */
					   GL_FALSE /* normalized */, array_length /* n_array_elements */, 0u /* stride */,
					   offset /* offset */, (GLvoid*)&m_data[offset] /* data */, size /* data_size */);
	}
	else
	{
		var = si.Output(name.c_str(), qual.c_str() /* qualifiers */, desc.m_component /* expected_componenet */,
						desc.m_location /* expected_location */, type, /* built_in_type */
						GL_FALSE /* normalized */, array_length /* n_array_elements */, 0u /* stride */,
						offset /* offset */, (GLvoid*)&m_data[offset] /* data */, size /* data_size */);
	}

	return var;
}